

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::updateRasterState(QRasterPaintEngine *this)

{
  CompositionMode CVar1;
  DirtyFlag DVar2;
  Spec SVar3;
  QRasterPaintEngineState *this_00;
  QFlags<QPaintEngine::DirtyFlag> *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  CompositionMode mode;
  QRasterPaintEngineState *s;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  DirtyFlag other;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = state((QRasterPaintEngine *)0x5627fa);
  if ((this_00->dirty & 0x40) != 0) {
    updateMatrix((QRasterPaintEngine *)this_00,
                 (QTransform *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  other = this_00->dirty;
  ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  local_c.super_QFlagsStorage<QPaintEngine::DirtyFlag>.i =
       (QFlagsStorage<QPaintEngine::DirtyFlag>)
       QFlags<QPaintEngine::DirtyFlag>::operator|(in_RDI,other);
  DVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if ((other & DVar2) != 0) {
    CVar1 = (this_00->super_QPainterState).composition_mode;
    bVar5 = false;
    if (((((*(ushort *)&(this_00->penData).field_0x88 & 0xff) == 1) &&
         (uVar8 = false, bVar5 = (bool)uVar8, this_00->intOpacity == 0x100)) &&
        (uVar7 = true, bVar5 = (bool)uVar7, CVar1 != CompositionMode_SourceOver)) &&
       (uVar6 = false, bVar5 = (bool)uVar6, CVar1 == CompositionMode_Source)) {
      SVar3 = QColor::spec(&(this_00->penData).solidColor);
      bVar5 = false;
      if (SVar3 != ExtendedRgb) {
        fVar4 = QColor::alphaF((QColor *)
                               ((ulong)CONCAT43(other,CONCAT12(uVar8,CONCAT11(uVar7,uVar6))) << 8));
        bVar5 = 1.0 <= fVar4;
      }
    }
    *(ushort *)&this_00->field_12 = *(ushort *)&this_00->field_12 & 0xffdf | (ushort)bVar5 << 5;
  }
  this_00->dirty = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::updateRasterState()
{
    QRasterPaintEngineState *s = state();

    if (s->dirty & DirtyTransform)
        updateMatrix(s->matrix);

    if (s->dirty & (DirtyPen|DirtyCompositionMode|DirtyOpacity)) {
        const QPainter::CompositionMode mode = s->composition_mode;
        s->flags.fast_text = (s->penData.type == QSpanData::Solid)
                       && s->intOpacity == 256
                       && (mode == QPainter::CompositionMode_SourceOver
                           || (mode == QPainter::CompositionMode_Source
                               && (s->penData.solidColor.spec() != QColor::ExtendedRgb &&
                                   s->penData.solidColor.alphaF() >= 1.0f)));
    }

    s->dirty = 0;
}